

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O0

void __thiscall
visitor_test_should_visit_incremental_refresh_frame_Test::
~visitor_test_should_visit_incremental_refresh_frame_Test
          (visitor_test_should_visit_incremental_refresh_frame_Test *this)

{
  visitor_test_should_visit_incremental_refresh_frame_Test *this_local;
  
  ~visitor_test_should_visit_incremental_refresh_frame_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(visitor_test, should_visit_incremental_refresh_frame)
{
    const char* frame = "8=FIX.4.2|9=407|35=X|34=002565204|52=20160908-08:42:10.359|49=Prov|56=MDABC|262=1364|268=4|"
                        "279=2|55=CHF/JPY|269=0|278=0453665272|270=00104.840000|271=001000000.00|15=CHF|"
                        "279=0|55=CHF/JPY|269=0|278=0453665276|270=00104.841000|271=001000000.00|15=CHF|"
                        "279=2|55=CHF/JPY|269=1|278=0453665273|270=00104.855000|271=001000000.00|15=CHF|"
                        "279=0|55=CHF/JPY|269=1|278=0453665277|270=00104.856000|271=001000000.00|15=CHF|"
                        "10=213";

    auto err = doVisit(frame, should_visit_incremental_refresh_frame::Visitor(), should_visit_incremental_refresh_frame::VisitRules());
    ASSERT_TRUE(err.isOk());
}